

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TextureUnitCase::uploadCubeTexture
          (TextureUnitCase *this,int texNdx,Context *context)

{
  TextureCube *pTVar1;
  deUint32 err;
  TextureFormat texFormat;
  TransferFormat TVar2;
  long lVar3;
  pointer pPVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long local_70;
  
  pTVar1 = (this->m_texturesCube).
           super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl.
           super__Vector_impl_data._M_start
           [(this->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[texNdx]];
  texFormat = glu::mapGLInternalFormat
                        ((this->m_textureParams).
                         super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                         ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat);
  TVar2 = glu::getTransferFormat(texFormat);
  (*context->_vptr_Context[0xf])(context,0xcf5,1);
  lVar3 = *(long *)&pTVar1->m_access[0].
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data;
  pPVar4 = pTVar1->m_access[0].
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_70 = 0;
  do {
    if (0 < (int)((ulong)((long)pPVar4 - lVar3) >> 3) * -0x33333333) {
      lVar6 = 8;
      lVar7 = 8;
      uVar5 = 0;
      do {
        if (*(long *)((long)pTVar1->m_data[local_70].
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar7) != 0) {
          lVar3 = (long)pTVar1->m_access[local_70].
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          (*context->_vptr_Context[0x11])
                    (context,(ulong)*(uint *)(s_cubeFaceTargets + local_70 * 4),uVar5 & 0xffffffff,
                     (ulong)(this->m_textureParams).
                            super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                            ._M_impl.super__Vector_impl_data._M_start[texNdx].internalFormat,
                     (ulong)*(uint *)(lVar3 + lVar6),(ulong)*(uint *)(lVar3 + 4 + lVar6),0,TVar2,
                     (ulong)TVar2 >> 0x20,*(undefined8 *)(lVar3 + 0x18 + lVar6));
          err = (*context->_vptr_Context[0x79])(context);
          glu::checkError(err,"Set cube map image data",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                          ,0x44d);
          lVar3 = *(long *)&pTVar1->m_access[0].
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data;
          pPVar4 = pTVar1->m_access[0].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar5 = uVar5 + 1;
        lVar7 = lVar7 + 0x10;
        lVar6 = lVar6 + 0x28;
      } while ((long)uVar5 < (long)((int)((ulong)((long)pPVar4 - lVar3) >> 3) * -0x33333333));
    }
    local_70 = local_70 + 1;
  } while (local_70 != 6);
  return;
}

Assistant:

void TextureUnitCase::uploadCubeTexture (int texNdx, sglr::Context& context)
{
	int							ndxCube		= m_ndxTexType[texNdx];
	const tcu::TextureCube*		texture		= m_texturesCube[ndxCube];
	glu::TransferFormat			formatGl	= glu::getTransferFormat(glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat));

	context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	for (int face = 0; face < (int)tcu::CUBEFACE_LAST; face++)
	{
		for (int levelNdx = 0; levelNdx < texture->getNumLevels(); levelNdx++)
		{
			if (texture->isLevelEmpty((tcu::CubeFace)face, levelNdx))
				continue;

			tcu::ConstPixelBufferAccess		access	= texture->getLevelFace(levelNdx, (tcu::CubeFace)face);
			int								width	= access.getWidth();
			int								height	= access.getHeight();

			DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

			context.texImage2D(s_cubeFaceTargets[face], levelNdx, m_textureParams[texNdx].internalFormat, width, height, 0 /* border */, formatGl.format, formatGl.dataType, access.getDataPtr());
			GLU_EXPECT_NO_ERROR(context.getError(), "Set cube map image data");
		}
	}
}